

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O3

ByteArray * __thiscall
EncodingTable::encodeString
          (ByteArray *__return_storage_ptr__,EncodingTable *this,string *str,bool writeTermination)

{
  pointer pTVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  ByteArray *pBVar3;
  ulong uVar4;
  ulong uVar5;
  size_t index;
  ByteArray result;
  byte local_71;
  byte local_70;
  undefined7 uStack_6f;
  undefined4 local_64;
  ByteArray *local_60;
  string *local_58;
  Trie *local_50;
  ByteArray local_48;
  
  local_64 = (undefined4)CONCAT71(in_register_00000009,writeTermination);
  local_60 = __return_storage_ptr__;
  ByteArray::ByteArray(&local_48);
  if (str->_M_string_length != 0) {
    local_50 = &this->lookup;
    uVar4 = 0;
    local_58 = str;
    do {
      bVar2 = Trie::findLongestPrefix
                        (local_50,(local_58->_M_dataplus)._M_p + uVar4,(size_t *)&local_70);
      pBVar3 = local_60;
      if (!bVar2) {
        ByteArray::ByteArray(local_60);
        goto LAB_0014f803;
      }
      pTVar1 = (this->entries).
               super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
               ._M_impl.super__Vector_impl_data._M_start + CONCAT71(uStack_6f,local_70);
      if (pTVar1->hexLen != 0) {
        uVar5 = 0;
        do {
          local_71 = (this->hexData).data_[uVar5 + pTVar1->hexPos];
          ByteArray::append(&local_48,&local_71,1);
          uVar5 = uVar5 + 1;
        } while (uVar5 < pTVar1->hexLen);
      }
      uVar4 = uVar4 + pTVar1->valueLen;
    } while (uVar4 < local_58->_M_string_length);
  }
  if (((char)local_64 != '\0') && ((this->terminationEntry).hexLen != 0)) {
    uVar4 = 0;
    do {
      local_70 = (this->hexData).data_[uVar4 + (this->terminationEntry).hexPos];
      ByteArray::append(&local_48,&local_70,1);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->terminationEntry).hexLen);
  }
  pBVar3 = local_60;
  ByteArray::ByteArray(local_60,&local_48);
LAB_0014f803:
  ByteArray::~ByteArray(&local_48);
  return pBVar3;
}

Assistant:

ByteArray EncodingTable::encodeString(const std::string& str, bool writeTermination)
{
	ByteArray result;

	size_t pos = 0;
	while (pos < str.size())
	{
		size_t index;
		if (!lookup.findLongestPrefix(str.c_str()+pos,index))
		{
			// error
			return ByteArray();
		}

		TableEntry& entry = entries[index];
		for (size_t i = 0; i < entry.hexLen; i++)
		{
			result.appendByte(hexData[entry.hexPos+i]);
		}

		pos += entry.valueLen;
	}

	if (writeTermination)
	{
		TableEntry& entry = terminationEntry;
		for (size_t i = 0; i < entry.hexLen; i++)
		{
			result.appendByte(hexData[entry.hexPos+i]);
		}
	}

	return result;
}